

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  long *plVar4;
  ostream *poVar5;
  Database db;
  Statement query;
  Database DStack_f8;
  Column local_d0;
  Column local_b8;
  Statement local_a0;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SQlite3 version ",0x10);
  sVar3 = strlen("3.39.3");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3.39.3",sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (",2);
  __s = SQLite::getLibVersion();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1d1220);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"SQliteC++ version ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3.02.00",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  SQLite::Database::Database(&DStack_f8,"test.db3",6,0,(char *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"SQLite database file \'",0x16);
  if (DStack_f8.mFilename._M_dataplus._M_p == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1d1220);
  }
  else {
    sVar3 = strlen(DStack_f8.mFilename._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,DStack_f8.mFilename._M_dataplus._M_p,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\' opened successfully\n",0x16);
  SQLite::Database::exec(&DStack_f8,"DROP TABLE IF EXISTS test");
  SQLite::Database::exec(&DStack_f8,"CREATE TABLE test (id INTEGER PRIMARY KEY, value TEXT)");
  iVar2 = SQLite::Database::exec(&DStack_f8,"INSERT INTO test VALUES (NULL, \"test\")");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"INSERT INTO test VALUES (NULL, \"test\")\", returned ",0x32);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  iVar2 = SQLite::Database::exec(&DStack_f8,"INSERT INTO test VALUES (NULL, \"second\")");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"INSERT INTO test VALUES (NULL, \"second\")\", returned ",0x34);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  iVar2 = SQLite::Database::exec
                    (&DStack_f8,"UPDATE test SET value=\"second-updated\" WHERE id=\'2\'");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "UPDATE test SET value=\"second-updated\" WHERE id=\'2\', returned ",0x3e);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  SQLite::Statement::Statement(&local_a0,&DStack_f8,"SELECT * FROM test");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"SELECT * FROM test :\n",0x15);
  while (bVar1 = SQLite::Statement::executeStep(&local_a0), bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"row (",5);
    SQLite::Statement::getColumn(&local_b8,&local_a0,0);
    poVar5 = SQLite::operator<<((ostream *)&std::cout,&local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", \"",3);
    SQLite::Statement::getColumn(&local_d0,&local_a0,1);
    poVar5 = SQLite::operator<<(poVar5,&local_d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
    if (local_d0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d0.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_b8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.mStmtPtr.super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  SQLite::Database::exec(&DStack_f8,"DROP TABLE test");
  SQLite::Statement::~Statement(&local_a0);
  SQLite::Database::~Database(&DStack_f8);
  remove("test.db3");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"everything ok, quitting\n",0x18);
  return 0;
}

Assistant:

int main ()
{
    // Using SQLITE_VERSION would require #include <sqlite3.h> which we want to avoid: use SQLite::VERSION if possible.
//  std::cout << "SQlite3 version " << SQLITE_VERSION << std::endl;
    std::cout << "SQlite3 version " << SQLite::VERSION << " (" << SQLite::getLibVersion() << ")" << std::endl;
    std::cout << "SQliteC++ version " << SQLITECPP_VERSION << std::endl;

    ////////////////////////////////////////////////////////////////////////////
    // Simple batch queries example :
    try
    {
        // Open a database file in create/write mode
        SQLite::Database    db("test.db3", SQLite::OPEN_READWRITE|SQLite::OPEN_CREATE);
        std::cout << "SQLite database file '" << db.getFilename().c_str() << "' opened successfully\n";

        // Create a new table with an explicit "id" column aliasing the underlying rowid
        db.exec("DROP TABLE IF EXISTS test");
        db.exec("CREATE TABLE test (id INTEGER PRIMARY KEY, value TEXT)");

        // first row
        int nb = db.exec("INSERT INTO test VALUES (NULL, \"test\")");
        std::cout << "INSERT INTO test VALUES (NULL, \"test\")\", returned " << nb << std::endl;

        // second row
        nb = db.exec("INSERT INTO test VALUES (NULL, \"second\")");
        std::cout << "INSERT INTO test VALUES (NULL, \"second\")\", returned " << nb << std::endl;

        // update the second row
        nb = db.exec("UPDATE test SET value=\"second-updated\" WHERE id='2'");
        std::cout << "UPDATE test SET value=\"second-updated\" WHERE id='2', returned " << nb << std::endl;

        // Check the results : expect two row of result
        SQLite::Statement   query(db, "SELECT * FROM test");
        std::cout << "SELECT * FROM test :\n";
        while (query.executeStep())
        {
            std::cout << "row (" << query.getColumn(0) << ", \"" << query.getColumn(1) << "\")\n";
        }

        db.exec("DROP TABLE test");
    }
    catch (std::exception& e)
    {
        std::cout << "SQLite exception: " << e.what() << std::endl;
        return EXIT_FAILURE; // unexpected error : exit the example program
    }
    remove("test.db3");

    std::cout << "everything ok, quitting\n";

    return EXIT_SUCCESS;
}